

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O2

void init_encode_rd_sb(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,
                      SIMPLE_MOTION_DATA_TREE *sms_root,RD_STATS *rd_cost,int mi_row,int mi_col,
                      int gather_tpl_data)

{
  byte bVar1;
  byte right_shift;
  byte bVar2;
  BLOCK_SIZE BVar3;
  DELTAQ_MODE DVar4;
  uint8_t uVar5;
  AV1_PRIMARY *pAVar6;
  SequenceHeader *pSVar7;
  TplDepFrame *pTVar8;
  TplDepStats *pTVar9;
  MB_MODE_INFO *pMVar10;
  MB_RD_RECORD *pMVar11;
  int8_t iVar12;
  int rf_idx;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar18;
  int j;
  int iVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  int col;
  bool bVar28;
  undefined8 local_b0;
  int64_t tpl_pred_error [7];
  int64_t inter_cost [7];
  ulong uVar17;
  
  if ((((((cpi->sf).part_sf.simple_motion_search_split != 0) ||
        ((cpi->sf).part_sf.simple_motion_search_prune_rect != 0)) ||
       ((cpi->sf).part_sf.simple_motion_search_early_term_none != 0)) ||
      ((cpi->sf).part_sf.ml_early_term_after_part_split_level != 0)) &&
     (((cpi->common).current_frame.frame_type & 0xfd) != 0)) {
    av1_init_simple_motion_search_mvs_for_sb
              (cpi,&tile_data->tile_info,&td->mb,sms_root,mi_row,mi_col);
  }
  pAVar6 = cpi->ppi;
  local_b0 = tile_data;
  if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (pAVar6->lap_enabled == 0)) &&
     (((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)))) goto LAB_00279866;
  bVar1 = cpi->gf_frame_index;
  right_shift = (pAVar6->tpl_data).tpl_stats_block_mis_log2;
  (td->mb).tpl_keep_ref_frame[0] = '\0';
  (td->mb).tpl_keep_ref_frame[1] = '\0';
  (td->mb).tpl_keep_ref_frame[2] = '\0';
  (td->mb).tpl_keep_ref_frame[3] = '\0';
  (td->mb).tpl_keep_ref_frame[4] = '\0';
  (td->mb).tpl_keep_ref_frame[5] = '\0';
  (td->mb).tpl_keep_ref_frame[6] = '\0';
  (td->mb).tpl_keep_ref_frame[7] = '\0';
  iVar13 = av1_tpl_stats_ready(&pAVar6->tpl_data,(uint)bVar1);
  if (((iVar13 != 0) && (bVar2 = (pAVar6->gf_group).update_type[cpi->gf_frame_index], bVar2 < 4)) &&
     ((bVar2 != 1 && ((cpi->oxcf).q_cfg.aq_mode == '\0')))) {
    if ((cpi->ppi->gf_group).update_type[bVar1] == '\x04') {
      builtin_memcpy((td->mb).tpl_keep_ref_frame,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
    }
    else {
      pTVar8 = (pAVar6->tpl_data).tpl_frame;
      pTVar9 = pTVar8[bVar1].tpl_stats_ptr;
      iVar13 = pTVar8[bVar1].stride;
      inter_cost[6] = 0;
      inter_cost[4] = 0;
      inter_cost[5] = 0;
      inter_cost[2] = 0;
      inter_cost[3] = 0;
      inter_cost[0] = 0;
      inter_cost[1] = 0;
      BVar3 = ((cpi->common).seq_params)->sb_size;
      iVar14 = (cpi->common).mi_params.mi_rows;
      iVar19 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [BVar3] + mi_row;
      if (iVar14 <= (int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [BVar3] + mi_row)) {
        iVar19 = iVar14;
      }
      uVar26 = (cpi->common).superres_upscaled_width + 7 >> 2 & 0xfffffffe;
      bVar1 = (cpi->common).superres_scale_denominator;
      uVar15 = (int)(((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [BVar3] + mi_col) * (uint)bVar1 + 4) / 8;
      if ((int)uVar15 < (int)uVar26) {
        uVar26 = uVar15;
      }
      for (iVar14 = mi_row; iVar21 = (int)((uint)bVar1 * mi_col + 4) / 8, iVar14 < iVar19;
          iVar14 = iVar14 + (1 << (right_shift & 0x1f))) {
        for (; iVar21 < (int)uVar26;
            iVar21 = iVar21 + (int)(((uint)bVar1 << (right_shift & 0x1f)) + 4) / 8) {
          iVar23 = av1_tpl_ptr_pos(iVar14,iVar21,iVar13,right_shift);
          tpl_pred_error[4] = 0;
          tpl_pred_error[5] = 0;
          tpl_pred_error[6] = 0;
          tpl_pred_error[2] = 0;
          tpl_pred_error[3] = 0;
          tpl_pred_error[0] = 0;
          tpl_pred_error[1] = 0;
          uVar20 = 0;
          uVar22 = 0;
          lVar27 = pTVar9[iVar23].pred_error[0];
          while (uVar20 != 6) {
            lVar25 = pTVar9[iVar23].pred_error[uVar20 + 1];
            uVar20 = uVar20 + 1;
            if (lVar25 != 0 && lVar25 < lVar27) {
              uVar22 = uVar20 & 0xffffffff;
              lVar27 = lVar25;
            }
          }
          tpl_pred_error[(int)uVar22] =
               pTVar9[iVar23].pred_error[(int)uVar22] - pTVar9[iVar23].pred_error[0];
          for (lVar27 = 1; lVar27 != 7; lVar27 = lVar27 + 1) {
            inter_cost[lVar27] = inter_cost[lVar27] + tpl_pred_error[lVar27];
          }
        }
      }
      uVar20 = 0;
LAB_0027953d:
      if (uVar20 != 6) {
        uVar22 = uVar20 + 1;
        *(int *)((long)tpl_pred_error + uVar20 * 4) = (int)uVar22;
        uVar18 = uVar22 & 0xffffffff;
        uVar16 = uVar20;
        do {
          uVar17 = uVar16;
          while( true ) {
            uVar16 = uVar17 - 1;
            uVar20 = uVar22;
            if ((long)uVar17 < 1) goto LAB_0027953d;
            uVar26 = *(uint *)((long)tpl_pred_error + uVar16 * 4);
            if (inter_cost[(int)uVar26] <= inter_cost[(int)uVar18]) break;
            *(int *)((long)tpl_pred_error + uVar16 * 4) = (int)uVar18;
            *(uint *)((long)tpl_pred_error + uVar16 * 4 + 4) = uVar26;
            uVar17 = uVar16;
          }
          uVar18 = (ulong)uVar26;
        } while( true );
      }
      (td->mb).tpl_keep_ref_frame[0] = '\x01';
      (td->mb).tpl_keep_ref_frame[1] = '\x01';
      bVar28 = false;
      for (uVar20 = 0; uVar20 != 6; uVar20 = uVar20 + 1) {
        lVar27 = (long)*(int *)((long)tpl_pred_error + uVar20 * 4);
        (td->mb).tpl_keep_ref_frame[lVar27 + 1] = '\x01';
        if (2 < uVar20) {
          if (!bVar28) {
            uVar22 = inter_cost[lVar27];
            uVar16 = -uVar22;
            if (0 < (long)uVar22) {
              uVar16 = uVar22;
            }
            uVar18 = inter_cost[*(int *)((long)tpl_pred_error + uVar20 * 4 + -4)];
            uVar17 = -uVar18;
            if (0 < (long)uVar18) {
              uVar17 = uVar18;
            }
            if ((uVar22 != 0) && (bVar28 = false, uVar17 >> 3 <= uVar16)) goto LAB_002795c2;
          }
          (td->mb).tpl_keep_ref_frame[lVar27 + 1] = '\0';
          bVar28 = true;
        }
LAB_002795c2:
      }
    }
  }
  (td->mb).sb_energy_level = 0;
  (td->mb).part_search_info.cnn_output_valid = 0;
  if ((gather_tpl_data == 0) || ((cpi->common).delta_q_info.delta_q_present_flag == 0))
  goto LAB_00279866;
  pSVar7 = (cpi->common).seq_params;
  bVar28 = pSVar7->monochrome == '\0';
  BVar3 = pSVar7->sb_size;
  av1_setup_src_planes(&td->mb,cpi->source,mi_row,mi_col,bVar28 + 1 + (uint)bVar28,BVar3);
  iVar13 = (cpi->common).delta_q_info.delta_q_res;
  iVar14 = (cpi->common).quant_params.base_qindex;
  if ((cpi->use_ducky_encode == 0) || ((cpi->ducky_encode_info).frame_info.qp_mode != '\x01')) {
    DVar4 = (cpi->oxcf).q_cfg.deltaq_mode;
    switch(DVar4) {
    case '\x01':
      if ((cpi->oxcf).algo_cfg.enable_tpl_model == true) {
        iVar14 = av1_get_q_for_deltaq_objective(cpi,td,(int64_t *)0x0,BVar3,mi_row,mi_col);
      }
      else if ((cpi->oxcf).q_cfg.enable_hdr_deltaq == true) goto LAB_00279698;
      break;
    case '\x02':
      iVar14 = av1_block_wavelet_energy_level(cpi,&td->mb,BVar3);
      (td->mb).sb_energy_level = iVar14;
      iVar14 = av1_compute_q_from_energy_level_deltaq_mode(cpi,iVar14);
      break;
    case '\x03':
      iVar14 = av1_get_sbq_perceptual_ai(cpi,BVar3,mi_row,mi_col);
      break;
    case '\x04':
      iVar14 = av1_get_sbq_user_rating_based(cpi,mi_row,mi_col);
      break;
    default:
      if ((cpi->oxcf).q_cfg.enable_hdr_deltaq == false) {
        if (DVar4 == '\x06') {
          iVar14 = av1_get_sbq_variance_boost(cpi,&td->mb);
        }
      }
      else {
LAB_00279698:
        iVar14 = av1_get_q_for_hdr(cpi,&td->mb,BVar3,mi_row,mi_col);
      }
    }
  }
  else {
    bVar1 = (byte)((cpi->common).seq_params)->mib_size_log2;
    iVar14 = (cpi->ducky_encode_info).frame_info.superblock_encode_qindex
             [(~(-1 << (bVar1 & 0x1f)) + (cpi->common).mi_params.mi_cols >> (bVar1 & 0x1f)) *
              (mi_row >> (bVar1 & 0x1f)) + (mi_col >> (bVar1 & 0x1f))];
  }
  (td->mb).rdmult_cur_qindex = iVar14;
  iVar13 = av1_adjust_q_from_delta_q_res(iVar13,(td->mb).e_mbd.current_base_qindex,iVar14);
  iVar14 = iVar13 - (cpi->common).quant_params.base_qindex;
  (td->mb).delta_qindex = iVar14;
  (td->mb).rdmult_delta_qindex = iVar14;
  av1_set_offsets(cpi,&local_b0->tile_info,&td->mb,mi_row,mi_col,BVar3);
  pMVar10 = *(td->mb).e_mbd.mi;
  pMVar10->current_qindex = iVar13;
  iVar14 = 0;
  av1_init_plane_quantizers(cpi,&td->mb,*(ushort *)&pMVar10->field_0xa7 & 7,0);
  iVar13 = (td->mb).delta_qindex;
  td->deltaq_used = td->deltaq_used | (uint)(iVar13 != 0);
  if ((cpi->oxcf).tool_cfg.enable_deltalf_mode == true) {
    iVar19 = (cpi->common).delta_q_info.delta_lf_res;
    uVar15 = iVar19 / 2 + iVar13 / 4 & -iVar19;
    uVar26 = 0x3f;
    if ((int)uVar15 < 0x3f) {
      uVar26 = uVar15;
    }
    iVar12 = -0x3f;
    if (-0x3f < (int)uVar26) {
      iVar12 = (int8_t)uVar26;
    }
    pSVar7 = (cpi->common).seq_params;
    uVar5 = pSVar7->monochrome;
    iVar13 = pSVar7->mib_size;
    iVar19 = mi_row;
    while( true ) {
      iVar21 = (cpi->common).mi_params.mi_rows - mi_row;
      if (iVar13 < iVar21) {
        iVar21 = iVar13;
      }
      if (iVar21 <= iVar14) break;
      iVar23 = 0;
      iVar21 = mi_col;
      while( true ) {
        iVar24 = (cpi->common).mi_params.mi_cols - mi_col;
        if (iVar13 < iVar24) {
          iVar24 = iVar13;
        }
        if (iVar24 <= iVar23) break;
        iVar24 = (cpi->common).mi_params.mi_stride;
        (cpi->common).mi_params.mi_alloc[iVar24 * (iVar14 + mi_row) + iVar23 + mi_col].
        delta_lf_from_base = iVar12;
        lVar25 = ((long)(iVar24 * iVar19) + (long)iVar21) * 0xb0 + 0xa3;
        lVar27 = (ulong)(uVar5 == '\0') * 2 + 2;
        while (bVar28 = lVar27 != 0, lVar27 = lVar27 + -1, bVar28) {
          *(int8_t *)((long)((cpi->common).mi_params.mi_alloc)->mv + lVar25 + -8) = iVar12;
          lVar25 = lVar25 + 1;
        }
        iVar23 = iVar23 + 1;
        iVar21 = iVar21 + 1;
      }
      iVar14 = iVar14 + 1;
      iVar19 = iVar19 + 1;
    }
  }
  av1_tpl_rdmult_setup_sb(cpi,&td->mb,BVar3,mi_row,mi_col);
LAB_00279866:
  (td->mb).reuse_inter_pred = false;
  (td->mb).txfm_search_params.mode_eval_type = 0;
  pMVar11 = (td->mb).txfm_search_info.mb_rd_record;
  if (pMVar11 != (MB_RD_RECORD *)0x0) {
    pMVar11->index_start = 0;
    pMVar11->num = 0;
  }
  memset((td->mb).picked_ref_frames_mask,0,0x1000);
  rd_cost->rate = 0x7fffffff;
  rd_cost->zero_rate = 0;
  rd_cost->dist = 0x7fffffffffffffff;
  rd_cost->rdcost = 0x7fffffffffffffff;
  rd_cost->sse = 0x7fffffffffffffff;
  rd_cost->skip_txfm = '\0';
  return;
}

Assistant:

static inline void init_encode_rd_sb(AV1_COMP *cpi, ThreadData *td,
                                     const TileDataEnc *tile_data,
                                     SIMPLE_MOTION_DATA_TREE *sms_root,
                                     RD_STATS *rd_cost, int mi_row, int mi_col,
                                     int gather_tpl_data) {
  const AV1_COMMON *cm = &cpi->common;
  const TileInfo *tile_info = &tile_data->tile_info;
  MACROBLOCK *x = &td->mb;

  const SPEED_FEATURES *sf = &cpi->sf;
  const int use_simple_motion_search =
      (sf->part_sf.simple_motion_search_split ||
       sf->part_sf.simple_motion_search_prune_rect ||
       sf->part_sf.simple_motion_search_early_term_none ||
       sf->part_sf.ml_early_term_after_part_split_level) &&
      !frame_is_intra_only(cm);
  if (use_simple_motion_search) {
    av1_init_simple_motion_search_mvs_for_sb(cpi, tile_info, x, sms_root,
                                             mi_row, mi_col);
  }

#if !CONFIG_REALTIME_ONLY
  if (!(has_no_stats_stage(cpi) && cpi->oxcf.mode == REALTIME &&
        cpi->oxcf.gf_cfg.lag_in_frames == 0)) {
    init_ref_frame_space(cpi, td, mi_row, mi_col);
    x->sb_energy_level = 0;
    x->part_search_info.cnn_output_valid = 0;
    if (gather_tpl_data) {
      if (cm->delta_q_info.delta_q_present_flag) {
        const int num_planes = av1_num_planes(cm);
        const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
        setup_delta_q(cpi, td, x, tile_info, mi_row, mi_col, num_planes);
        av1_tpl_rdmult_setup_sb(cpi, x, sb_size, mi_row, mi_col);
      }

      // TODO(jingning): revisit this function.
      if (cpi->oxcf.algo_cfg.enable_tpl_model && (0)) {
        adjust_rdmult_tpl_model(cpi, x, mi_row, mi_col);
      }
    }
  }
#else
  (void)tile_info;
  (void)mi_row;
  (void)mi_col;
  (void)gather_tpl_data;
#endif

  x->reuse_inter_pred = false;
  x->txfm_search_params.mode_eval_type = DEFAULT_EVAL;
  reset_mb_rd_record(x->txfm_search_info.mb_rd_record);
  av1_zero(x->picked_ref_frames_mask);
  av1_invalid_rd_stats(rd_cost);
}